

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

void __thiscall sector_t::GetSpecial(sector_t *this,secspecial_t *spec)

{
  spec->special = this->special;
  spec->damageamount = this->damageamount;
  (spec->damagetype).super_FName.Index = (this->damagetype).super_FName.Index;
  spec->damageinterval = this->damageinterval;
  spec->leakydamage = this->leakydamage;
  spec->Flags = this->Flags & 0x7b0;
  return;
}

Assistant:

void sector_t::GetSpecial(secspecial_t *spec)
{
	spec->special = special;
	spec->damageamount = damageamount;
	spec->damagetype = damagetype;
	spec->damageinterval = damageinterval;
	spec->leakydamage = leakydamage;
	spec->Flags = Flags & SECF_SPECIALFLAGS;
}